

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O0

char * labelFromModel(mdl_t *mdl,char *inBuf)

{
  int iVar1;
  size_t sVar2;
  FILE *__stream;
  FILE *__stream_00;
  char *in_RSI;
  mdl_t *in_RDI;
  FILE *fout;
  FILE *fin;
  char *outBuf;
  int bufSize;
  char *local_8;
  
  sVar2 = strlen(in_RSI);
  iVar1 = (int)(sVar2 << 1);
  local_8 = (char *)operator_new__((long)iVar1);
  memset(local_8,0,(long)iVar1);
  sVar2 = strlen(in_RSI);
  __stream = fmemopen(in_RSI,sVar2,"r");
  if (__stream == (FILE *)0x0) {
    pfatal("Cannot open input data buffer: %s\n",in_RSI);
  }
  __stream_00 = fmemopen(local_8,(long)iVar1,"w");
  if (__stream_00 == (FILE *)0x0) {
    pfatal("Cannot open output data buffer");
  }
  iVar1 = tag_label(in_RDI,(FILE *)__stream,(FILE *)__stream_00);
  if (iVar1 == 0) {
    warning("Cannot apply patterns, most likely wrong input data\n");
    local_8 = (char *)0x0;
  }
  else {
    fclose(__stream);
    fclose(__stream_00);
  }
  return local_8;
}

Assistant:

char* labelFromModel(mdl_t *mdl, char* inBuf) {
        int bufSize = strlen(inBuf) * 2;
        char* outBuf = new char[bufSize];
        memset(outBuf, 0, bufSize);

    	// Open input and output files
    	FILE *fin, *fout;

        fin = fmemopen(inBuf, strlen(inBuf), "r");
        if (fin == NULL) {
            pfatal("Cannot open input data buffer: %s\n", inBuf);
        }

        fout = fmemopen(outBuf, bufSize, "w");
        if (fout == NULL) {
            pfatal("Cannot open output data buffer");
        }

    	// Do the labelling
    	//info("* Label sequences\n");
    	if (!tag_label(mdl, fin, fout)) {
            warning("Cannot apply patterns, most likely wrong input data\n");
            return NULL;
        }
    	//info("* Done\n");
    	// And close files
//    	if (mdl->opt->input != NULL)
    		fclose(fin);
  //  	if (mdl->opt->output != NULL)
    		fclose(fout);

        return outBuf;
    }